

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mtmsr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 msr;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->pr & 1U) == 0) {
    uVar1 = tb_cflags((ctx->base).tb);
    if ((uVar1 & 0x20000) != 0) {
      gen_io_start(tcg_ctx_00);
    }
    if ((ctx->opcode & 0x10000) == 0) {
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      gen_update_nip(ctx,(ctx->base).pc_next);
      pTVar2 = cpu_msr;
      uVar1 = rS(ctx->opcode);
      tcg_gen_deposit_i64_ppc64(tcg_ctx_00,pTVar3,pTVar2,cpu_gpr[uVar1],0,0x20);
      gen_helper_store_msr(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar3);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
    }
    else {
      pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      uVar1 = rS(ctx->opcode);
      tcg_gen_andi_i64_ppc64(tcg_ctx_00,pTVar2,cpu_gpr[uVar1],0x8002);
      tcg_gen_andi_i64_ppc64(tcg_ctx_00,pTVar3,cpu_msr,-0x8003);
      tcg_gen_or_i64_ppc64(tcg_ctx_00,pTVar3,pTVar3,pTVar2);
      gen_helper_store_msr(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar3);
      tcg_temp_free_i64(tcg_ctx_00,pTVar2);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
    }
    gen_stop_exception(ctx);
  }
  else {
    gen_priv_exception(ctx,1);
  }
  return;
}

Assistant:

static void gen_mtmsr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CHK_SV;

    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    if (ctx->opcode & 0x00010000) {
        /* L=1 form only updates EE and RI */
        TCGv t0 = tcg_temp_new(tcg_ctx);
        TCGv t1 = tcg_temp_new(tcg_ctx);
        tcg_gen_andi_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)],
                        (1 << MSR_RI) | (1 << MSR_EE));
        tcg_gen_andi_tl(tcg_ctx, t1, cpu_msr,
                        ~(target_ulong)((1 << MSR_RI) | (1 << MSR_EE)));
        tcg_gen_or_tl(tcg_ctx, t1, t1, t0);

        gen_helper_store_msr(tcg_ctx, tcg_ctx->cpu_env, t1);
        tcg_temp_free(tcg_ctx, t0);
        tcg_temp_free(tcg_ctx, t1);

    } else {
        TCGv msr = tcg_temp_new(tcg_ctx);

        /*
         * XXX: we need to update nip before the store if we enter
         *      power saving mode, we will exit the loop directly from
         *      ppc_store_msr
         */
        gen_update_nip(ctx, ctx->base.pc_next);
#if defined(TARGET_PPC64)
        tcg_gen_deposit_tl(tcg_ctx, msr, cpu_msr, cpu_gpr[rS(ctx->opcode)], 0, 32);
#else
        tcg_gen_mov_tl(tcg_ctx, msr, cpu_gpr[rS(ctx->opcode)]);
#endif
        gen_helper_store_msr(tcg_ctx, tcg_ctx->cpu_env, msr);
        tcg_temp_free(tcg_ctx, msr);
    }
    /* Must stop the translation as machine state (may have) changed */
    gen_stop_exception(ctx);
}